

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

Move __thiscall Board::checkMove(Board *this,size_t row,size_t col)

{
  reference pvVar1;
  size_t col_local;
  size_t row_local;
  Board *this_local;
  
  if ((row != 0) &&
     (pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->values,(row - 1) * this->sizeInt + col), *pvVar1 == this->nullValue
     )) {
    makeMove(this,row,col,row - 1,col);
    return UP;
  }
  if ((col < this->sizeInt - 1) &&
     (pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->values,row * this->sizeInt + col + 1), *pvVar1 == this->nullValue))
  {
    makeMove(this,row,col,row,col + 1);
    return RIGHT;
  }
  if ((row < this->sizeInt - 1) &&
     (pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->values,(row + 1) * this->sizeInt + col), *pvVar1 == this->nullValue
     )) {
    makeMove(this,row,col,row + 1,col);
    return DOWN;
  }
  if ((col != 0) &&
     (pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                         (&this->values,(row * this->sizeInt + col) - 1), *pvVar1 == this->nullValue
     )) {
    makeMove(this,row,col,row,col - 1);
    return LEFT;
  }
  return NOT_ALLOWED;
}

Assistant:

Move Board::checkMove( size_t row, size_t col )
{        
    if ( row > 0 && ( values.at(( row - 1 ) * sizeInt + col ) == nullValue ))
    {
        makeMove( row, col, row - 1, col );
        return Move::UP;
    }
    if ( col < ( sizeInt - 1 ) && ( values.at( row * sizeInt + col + 1 ) == nullValue ))
    {
        makeMove( row, col, row, col + 1 );
        return Move::RIGHT;
    }
    if ( row < ( sizeInt - 1 ) && ( values.at(( row + 1 ) * sizeInt + col )  == nullValue ))
    {
        makeMove( row, col, row + 1, col );
        return Move::DOWN;
    }
    if ( col > 0 && ( values.at( row * sizeInt + col - 1 ) == nullValue ))
    {
        makeMove( row, col, row, col -1 );
        return Move::LEFT;
    }

    return Move::NOT_ALLOWED;
}